

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# C++20Support.hpp
# Opt level: O3

string * std::format<unsigned_short&>
                   (string *__return_storage_ptr__,string_view fmt,unsigned_short *ts)

{
  char *pcVar1;
  char *pcVar2;
  ostream *poVar3;
  char *pcVar4;
  size_t sVar5;
  ulong uVar6;
  size_t sVar7;
  long lVar8;
  array<std::basic_string_view<char,_std::char_traits<char>_>,_32UL> fragments;
  stringstream ss;
  size_t asStack_3c0 [2];
  char *local_3b0;
  long alStack_3a8 [62];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  pcVar4 = fmt._M_str;
  sVar7 = fmt._M_len;
  uVar6 = 0;
  asStack_3c0[0] = 0x118c92;
  memset(asStack_3c0 + 1,0,0x200);
  pcVar2 = pcVar4;
  if (sVar7 != 0) {
    sVar5 = 0;
    uVar6 = 0;
    pcVar1 = pcVar4;
    do {
      pcVar2 = pcVar4 + sVar5;
      if ((pcVar4[sVar5] != '}') && (pcVar2 = pcVar1, pcVar4[sVar5] == '{')) {
        if (pcVar1 == pcVar4) {
          asStack_3c0[uVar6 * 2 + 1] = sVar5;
          (&local_3b0)[uVar6 * 2] = pcVar4;
          pcVar2 = pcVar4;
          uVar6 = uVar6 + 1;
        }
        else if (uVar6 < 0x20 && pcVar4 + sVar5 != pcVar1) {
          asStack_3c0[uVar6 * 2 + 1] = (size_t)(pcVar4 + ((sVar5 - 1) - (long)pcVar1));
          (&local_3b0)[uVar6 * 2] = pcVar1 + 1;
          uVar6 = uVar6 + 1;
        }
      }
      sVar5 = sVar5 + 1;
      pcVar1 = pcVar2;
    } while (sVar7 != sVar5);
  }
  pcVar2 = pcVar2 + 1;
  if (pcVar2 != pcVar4 + sVar7) {
    asStack_3c0[uVar6 * 2 + 1] = (long)(pcVar4 + sVar7) - (long)pcVar2;
    (&local_3b0)[uVar6 * 2] = pcVar2;
  }
  asStack_3c0[0] = 0x118d45;
  std::__cxx11::stringstream::stringstream(local_1b8);
  asStack_3c0[0] = 0x118d5e;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,local_3b0,asStack_3c0[1]);
  asStack_3c0[0] = 0x118d6a;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  for (lVar8 = 0x18; lVar8 != 0x208; lVar8 = lVar8 + 0x10) {
    asStack_3c0[0] = 0x118d8e;
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,*(char **)((long)asStack_3c0 + lVar8 + 8U),
               *(long *)((long)asStack_3c0 + lVar8));
  }
  asStack_3c0[0] = 0x118da0;
  std::__cxx11::stringbuf::str();
  asStack_3c0[0] = 0x118db4;
  std::__cxx11::stringstream::~stringstream(local_1b8);
  asStack_3c0[0] = 0x118dc1;
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

string format(std::string_view fmt, auto&&... ts) {
    if (sizeof...(ts) == 0) return std::string(fmt);
    std::array<std::string_view, 32> fragments{};
    if (sizeof...(ts) > fragments.size()) throw std::length_error("format parameters count limit exceeded");
    size_t index = 0;
    auto start = fmt.cbegin(), parser = start;
    while (parser != fmt.cend()) {
        if (*parser == '{') {
            if (start == fmt.cbegin())
                fragments[index++] = std::string_view(start, static_cast<size_t>(parser - start));          /// string_view constructor with iterators is missing in Apple Clang 13
            else if (start != parser && index < fragments.size())
                fragments[index++] = std::string_view(start + 1, static_cast<size_t>(parser - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13
        }
        else if (*parser == '}')
            start = parser;
        ++parser;
    }
    if (start + 1 != fmt.cend()) fragments[index++] = std::string_view(start + 1, static_cast<size_t>(fmt.cend() - (start + 1)));/// string_view constructor with iterators is missing in Apple Clang 13

    auto frag = fragments.cbegin();
    stringstream ss;
    using webfront::operator<<;
    ((ss << *frag++ << std::forward<decltype(ts)>(ts)), ...);
    while (frag != fragments.cend()) ss << *frag++;
    return ss.str();
}